

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffpcn(fitsfile *fptr,int datatype,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem
         ,void *array,void *nulval,int *status)

{
  int in_ESI;
  void *in_RDI;
  fitsfile *in_R8;
  undefined8 in_R9;
  char **unaff_retaddr;
  undefined4 in_stack_00000008;
  float in_stack_0000000c;
  double *in_stack_00000010;
  uchar in_stack_00000040;
  undefined1 in_stack_00000041;
  undefined2 in_stack_00000042;
  undefined4 in_stack_00000044;
  int *in_stack_00000048;
  LONGLONG in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(int *)nelem < 1) {
    if (in_stack_00000010 == (double *)0x0) {
      ffpcl(in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9,in_stack_ffffffffffffffc8,nelem,
            CONCAT44(in_stack_0000000c,in_stack_00000008),in_RDI,
            (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      iVar1 = *(int *)nelem;
    }
    else {
      if (in_ESI == 0xb) {
        ffpcnb((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
               CONCAT44(in_stack_0000000c,in_stack_00000008),(uchar *)unaff_retaddr,
               in_stack_00000040,in_stack_00000048);
      }
      else if (in_ESI == 0xc) {
        ffpcnsb((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
                CONCAT44(in_stack_0000000c,in_stack_00000008),(char *)unaff_retaddr,
                in_stack_00000040,in_stack_00000048);
      }
      else if (in_ESI == 0x14) {
        ffpcnui((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
                CONCAT44(in_stack_0000000c,in_stack_00000008),(unsigned_short *)unaff_retaddr,
                CONCAT11(in_stack_00000041,in_stack_00000040),in_stack_00000048);
      }
      else if (in_ESI == 0x15) {
        ffpcni((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
               CONCAT44(in_stack_0000000c,in_stack_00000008),(short *)unaff_retaddr,
               CONCAT11(in_stack_00000041,in_stack_00000040),in_stack_00000048);
      }
      else if (in_ESI == 0x1e) {
        ffpcnuk((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
                CONCAT44(in_stack_0000000c,in_stack_00000008),(uint *)unaff_retaddr,
                CONCAT22(in_stack_00000042,CONCAT11(in_stack_00000041,in_stack_00000040)),
                in_stack_00000048);
      }
      else if (in_ESI == 0x1f) {
        ffpcnk((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
               CONCAT44(in_stack_0000000c,in_stack_00000008),(int *)unaff_retaddr,
               CONCAT22(in_stack_00000042,CONCAT11(in_stack_00000041,in_stack_00000040)),
               in_stack_00000048);
      }
      else if (in_ESI == 0x28) {
        ffpcnuj((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
                CONCAT44(in_stack_0000000c,in_stack_00000008),(unsigned_long *)unaff_retaddr,
                CONCAT44(in_stack_00000044,
                         CONCAT22(in_stack_00000042,CONCAT11(in_stack_00000041,in_stack_00000040))),
                in_stack_00000048);
      }
      else if (in_ESI == 0x29) {
        ffpcnj((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
               CONCAT44(in_stack_0000000c,in_stack_00000008),(long *)unaff_retaddr,
               CONCAT44(in_stack_00000044,
                        CONCAT22(in_stack_00000042,CONCAT11(in_stack_00000041,in_stack_00000040))),
               in_stack_00000048);
      }
      else if (in_ESI == 0x50) {
        ffpcnujj((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
                 CONCAT44(in_stack_0000000c,in_stack_00000008),(ULONGLONG *)unaff_retaddr,
                 CONCAT44(in_stack_00000044,
                          CONCAT22(in_stack_00000042,CONCAT11(in_stack_00000041,in_stack_00000040)))
                 ,in_stack_00000048);
      }
      else if (in_ESI == 0x51) {
        ffpcnjj((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
                CONCAT44(in_stack_0000000c,in_stack_00000008),(LONGLONG *)unaff_retaddr,
                CONCAT44(in_stack_00000044,
                         CONCAT22(in_stack_00000042,CONCAT11(in_stack_00000041,in_stack_00000040))),
                in_stack_00000048);
      }
      else if (in_ESI == 0x2a) {
        ffpcne(fptr,datatype,firstrow,firstelem,nelem,(float *)in_stack_00000010,in_stack_0000000c,
               (int *)array);
      }
      else if (in_ESI == 0x52) {
        ffpcnd(fptr,datatype,firstrow,firstelem,nelem,in_stack_00000010,
               (double)CONCAT44(in_stack_0000000c,in_stack_00000008),(int *)array);
      }
      else if (in_ESI == 0x53) {
        ffpcne(fptr,datatype,firstrow,firstelem,nelem,(float *)in_stack_00000010,in_stack_0000000c,
               (int *)array);
      }
      else if (in_ESI == 0xa3) {
        ffpcnd(fptr,datatype,firstrow,firstelem,nelem,in_stack_00000010,
               (double)CONCAT44(in_stack_0000000c,in_stack_00000008),(int *)array);
      }
      else if (in_ESI == 0xe) {
        ffpcnl((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
               CONCAT44(in_stack_0000000c,in_stack_00000008),(char *)unaff_retaddr,in_stack_00000040
               ,in_stack_00000048);
      }
      else if (in_ESI == 0x10) {
        ffpcns((fitsfile *)firstrow,firstelem._4_4_,nelem,(LONGLONG)in_stack_00000010,
               CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
               (char *)CONCAT44(in_stack_00000044,
                                CONCAT22(in_stack_00000042,
                                         CONCAT11(in_stack_00000041,in_stack_00000040))),
               in_stack_00000048);
      }
      else {
        *(undefined4 *)nelem = 0x19a;
      }
      iVar1 = *(int *)nelem;
    }
  }
  else {
    iVar1 = *(int *)nelem;
  }
  return iVar1;
}

Assistant:

int ffpcn(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of elements to write             */
            void  *array,    /* I - array of values that are written        */
            void  *nulval,   /* I - pointer to the null value               */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a table column.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS column is not the same as the array being written).

*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (nulval == NULL)  /* null value not defined? */
    {
        ffpcl(fptr, datatype, colnum, firstrow, firstelem, nelem, array,
              status);
        return(*status);
    }

    if (datatype == TBYTE)
    {
      ffpcnb(fptr, colnum, firstrow, firstelem, nelem, (unsigned char *) array,
            *(unsigned char *) nulval, status);
    }
    else if (datatype == TSBYTE)
    {
      ffpcnsb(fptr, colnum, firstrow, firstelem, nelem, (signed char *) array,
            *(signed char *) nulval, status);
    }
    else if (datatype == TUSHORT)
    {
     ffpcnui(fptr, colnum, firstrow, firstelem, nelem, (unsigned short *) array,
             *(unsigned short *) nulval, status);
    }
    else if (datatype == TSHORT)
    {
      ffpcni(fptr, colnum, firstrow, firstelem, nelem, (short *) array,
             *(unsigned short *) nulval, status);
    }
    else if (datatype == TUINT)
    {
      ffpcnuk(fptr, colnum, firstrow, firstelem, nelem, (unsigned int *) array,
             *(unsigned int *) nulval, status);
    }
    else if (datatype == TINT)
    {
      ffpcnk(fptr, colnum, firstrow, firstelem, nelem, (int *) array,
             *(int *) nulval, status);
    }
    else if (datatype == TULONG)
    {
      ffpcnuj(fptr, colnum, firstrow, firstelem, nelem, (unsigned long *) array,
              *(unsigned long *) nulval, status);
    }
    else if (datatype == TLONG)
    {
      ffpcnj(fptr, colnum, firstrow, firstelem, nelem, (long *) array,
             *(long *) nulval, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffpcnujj(fptr, colnum, firstrow, firstelem, nelem, (ULONGLONG *) array,
             *(ULONGLONG *) nulval, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffpcnjj(fptr, colnum, firstrow, firstelem, nelem, (LONGLONG *) array,
             *(LONGLONG *) nulval, status);
    }
    else if (datatype == TFLOAT)
    {
      ffpcne(fptr, colnum, firstrow, firstelem, nelem, (float *) array,
             *(float *) nulval, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffpcnd(fptr, colnum, firstrow, firstelem, nelem, (double *) array,
             *(double *) nulval, status);
    }
    else if (datatype == TCOMPLEX)
    {
      ffpcne(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
             (float *) array, *(float *) nulval, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
      ffpcnd(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
             (double *) array, *(double *) nulval, status);
    }
    else if (datatype == TLOGICAL)
    {
      ffpcnl(fptr, colnum, firstrow, firstelem, nelem, (char *) array,
             *(char *) nulval, status);
    }
    else if (datatype == TSTRING)
    {
      ffpcns(fptr, colnum, firstrow, firstelem, nelem, (char **) array,
             (char *) nulval, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}